

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostInfo_p.cpp
# Opt level: O3

string * __thiscall
BamTools::Internal::HostInfo::HostName_abi_cxx11_(string *__return_storage_ptr__,HostInfo *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_hostName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_hostName)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string HostInfo::HostName() const
{
    return m_hostName;
}